

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::UniformInfiniteLight::ToString_abi_cxx11_
          (string *__return_storage_ptr__,UniformInfiniteLight *this)

{
  DenselySampledSpectrum *in_R8;
  string sStack_38;
  
  LightBase::BaseToString_abi_cxx11_(&sStack_38,&this->super_LightBase);
  StringPrintf<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&>
            (__return_storage_ptr__,(pbrt *)"[ UniformInfiniteLight %s Lemit: %s ]",
             (char *)&sStack_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->Lemit,in_R8
            );
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string UniformInfiniteLight::ToString() const {
    return StringPrintf("[ UniformInfiniteLight %s Lemit: %s ]", BaseToString(), Lemit);
}